

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

int check_plan(void)

{
  int iVar1;
  bool bVar2;
  undefined8 in_RAX;
  int iVar3;
  int local_14;
  
  iVar3 = 0;
  if (tests_done[level] != plan_test[level]) {
    check_plan_cold_1();
    iVar3 = -1;
  }
  local_14 = (int)((ulong)in_RAX >> 0x20);
  if (tests_failed[level] != 0) {
    check_plan_cold_2();
    iVar3 = local_14;
  }
  iVar1 = level + -1;
  bVar2 = 0 < level;
  level = iVar1;
  if (bVar2) {
    _ok((uint)(iVar3 == 0),"r == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/unit.c",0x39,
        "subtests");
  }
  return iVar3;
}

Assistant:

int
check_plan(void)
{
	int r = 0;
	if (tests_done[level] != plan_test[level]) {
		_space(stderr);
		fprintf(stderr,
			"# Looks like you planned %d tests but ran %d.\n",
			plan_test[level], tests_done[level]);
		r = -1;
	}

	if (tests_failed[level]) {
		_space(stderr);
		fprintf(stderr,
			"# Looks like you failed %d test of %d run.\n",
			tests_failed[level], tests_done[level]);
		r = tests_failed[level];
	}
	--level;
	if (level >= 0) {
		is(r, 0, "subtests");
	}
	return r;
}